

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

short __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,short,duckdb::QuantileIndirect<short>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<short> *accessor)

{
  RESULT_TYPE_conflict input;
  short sVar1;
  unsigned_long local_8;
  
  local_8 = lidx;
  input = QuantileIndirect<short>::operator()(accessor,&local_8);
  sVar1 = Cast::Operation<short,short>(input);
  return sVar1;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}